

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Native::Length(BasicValue *__return_storage_ptr__,
                   list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  bool bVar1;
  int I;
  reference this;
  element_type *this_00;
  size_type sVar2;
  BasicValue *Arg;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args_local;
  
  bVar1 = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::empty(Args);
  if (bVar1) {
    BasicValue::BasicValue(__return_storage_ptr__,0);
  }
  else {
    this = std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::front(Args);
    bVar1 = BasicValue::isArray(this);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->ArrayPtr);
      sVar2 = std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::size(this_00);
      BasicValue::BasicValue(__return_storage_ptr__,(int)sVar2);
    }
    else {
      bVar1 = BasicValue::isString(this);
      if (bVar1) {
        I = std::__cxx11::string::size();
        BasicValue::BasicValue(__return_storage_ptr__,I);
      }
      else {
        BasicValue::BasicValue(__return_storage_ptr__,0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BasicValue
Native::Length(std::list<BasicValue, std::allocator<BasicValue>> &Args) {
  if (Args.empty())
    return 0;
  const BasicValue &Arg = Args.front();
  if (Arg.isArray())
    return static_cast<int>(Arg.ArrayPtr->size());
  if (Arg.isString())
    return static_cast<int>(Arg.StrVal.size());
  return 0;
}